

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<double,unsigned_short>
          (BaseAppender *this,Vector *col,double input)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  unsigned_short result;
  uint16_t local_42;
  double local_40;
  string local_38;
  
  this_01 = (duckdb *)0x0;
  local_40 = input;
  bVar1 = TryCast::Operation<double,unsigned_short>(input,&local_42,false);
  if (bVar1) {
    *(uint16_t *)(col->data + (this->chunk).count * 2) = local_42;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<double,unsigned_short>(&local_38,this_01,local_40);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}